

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration.c
# Opt level: O0

value configuration_value_type(configuration config,char *key,type_id id)

{
  int iVar1;
  int in_EDX;
  long in_RDI;
  value v;
  char *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  value local_8;
  
  if (in_RDI == 0) {
    local_8 = (value)0x0;
  }
  else {
    local_8 = configuration_object_get
                        ((configuration)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                         in_stack_ffffffffffffffd8);
    if (local_8 == (value)0x0) {
      local_8 = (value)0x0;
    }
    else {
      iVar1 = value_type_id(local_8);
      if (iVar1 != in_EDX) {
        local_8 = (value)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

value configuration_value_type(configuration config, const char *key, type_id id)
{
	if (config == NULL)
	{
		return NULL;
	}

	value v = configuration_object_get(config, key);

	if (v == NULL)
	{
		return NULL;
	}

	if (value_type_id(v) != id)
	{
		return NULL;
	}

	return v;
}